

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>
* __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_>
::Iterator::Current(Iterator *this)

{
  tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>
  *ptVar1;
  _func_int_unsigned_short_ptr_int_int_ptr_int *p_Var2;
  tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>
  *ptVar3;
  
  if ((this->value_)._M_t.
      super___uniq_ptr_impl<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>,_std::default_delete<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_*,_std::default_delete<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_>_>
      .
      super__Head_base<0UL,_const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_*,_false>
      ._M_head_impl ==
      (tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>
       *)0x0) {
    ptVar3 = (tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>
              *)operator_new(0x10);
    ptVar1 = (this->iterator_)._M_current;
    p_Var2 = (ptVar1->
             super__Tuple_impl<0UL,_int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>
             ).super__Head_base<0UL,_int_(*)(const_unsigned_short_*,_int,_int_*,_int),_false>.
             _M_head_impl;
    (ptVar3->
    super__Tuple_impl<0UL,_int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>
    ).super__Tuple_impl<1UL,_int_(*)(const_unsigned_short_*,_int,_int_*,_int)> =
         (_Tuple_impl<1UL,_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>)
         (ptVar1->
         super__Tuple_impl<0UL,_int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>
         ).super__Tuple_impl<1UL,_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>.
         super__Head_base<1UL,_int_(*)(const_unsigned_short_*,_int,_int_*,_int),_false>._M_head_impl
    ;
    (ptVar3->
    super__Tuple_impl<0UL,_int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>
    ).super__Head_base<0UL,_int_(*)(const_unsigned_short_*,_int,_int_*,_int),_false>._M_head_impl =
         p_Var2;
    (this->value_)._M_t.
    super___uniq_ptr_impl<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>,_std::default_delete<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_*,_std::default_delete<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_>_>
    .
    super__Head_base<0UL,_const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_*,_false>
    ._M_head_impl = ptVar3;
  }
  return (this->value_)._M_t.
         super___uniq_ptr_impl<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>,_std::default_delete<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_*,_std::default_delete<const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_>_>
         .
         super__Head_base<0UL,_const_std::tuple<int_(*)(const_unsigned_short_*,_int,_int_*,_int),_int_(*)(const_unsigned_short_*,_int,_int_*,_int)>_*,_false>
         ._M_head_impl;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }